

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::OnTimeout(cmProcess *this)

{
  State SVar1;
  bool bVar2;
  pointer this_00;
  cmCTestTestProperties *pcVar3;
  Signal *pSVar4;
  duration<double,_std::ratio<1L,_1L>_> *__u;
  uv_process_s *puVar5;
  bool was_still_reading;
  cmCTestTestProperties *p;
  bool wasExecuting;
  cmProcess *this_local;
  
  SVar1 = this->ProcessState;
  this->ProcessState = Expired;
  if ((SVar1 == Executing) && (this->TimeoutReason_ == Normal)) {
    this_00 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->
                        (&this->Runner);
    pcVar3 = cmCTestRunTest::GetTestProperties(this_00);
    bVar2 = std::optional::operator_cast_to_bool((optional *)&pcVar3->TimeoutSignal);
    if (bVar2) {
      this->TerminationStyle = Custom;
      puVar5 = ::cm::uv_handle_ptr_::operator_cast_to_uv_process_s_
                         ((uv_handle_ptr_ *)&this->Process);
      pSVar4 = std::optional<cmCTestTestHandler::Signal>::operator->(&pcVar3->TimeoutSignal);
      uv_process_kill(puVar5,pSVar4->Number);
      bVar2 = std::optional::operator_cast_to_bool((optional *)&pcVar3->TimeoutGracePeriod);
      if (bVar2) {
        __u = std::optional<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::operator*
                        (&pcVar3->TimeoutGracePeriod);
        std::optional<std::chrono::duration<double,std::ratio<1l,1l>>>::operator=
                  ((optional<std::chrono::duration<double,std::ratio<1l,1l>>> *)this,__u);
      }
      else {
        std::optional<std::chrono::duration<double,std::ratio<1l,1l>>>::operator=
                  ((optional<std::chrono::duration<double,std::ratio<1l,1l>>> *)this,
                   &OnTimeout::defaultGracePeriod);
      }
      StartTimer(this);
      return;
    }
  }
  this->TerminationStyle = Forced;
  bVar2 = this->ReadHandleClosed;
  if ((this->ReadHandleClosed & 1U) == 0) {
    this->ReadHandleClosed = true;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader)
    ;
  }
  if ((this->ProcessHandleClosed & 1U) == 0) {
    puVar5 = ::cm::uv_handle_ptr_base_<uv_process_s>::operator->
                       ((uv_handle_ptr_base_<uv_process_s> *)&this->Process);
    cmsysProcess_KillPID((long)puVar5->pid);
  }
  else if (((bVar2 ^ 0xffU) & 1) != 0) {
    Finish(this);
  }
  return;
}

Assistant:

void cmProcess::OnTimeout()
{
  bool const wasExecuting = this->ProcessState == cmProcess::State::Executing;
  this->ProcessState = cmProcess::State::Expired;

  // If the test process is still executing normally, and we timed out because
  // the test timeout was reached, send the custom timeout signal, if any.
  if (wasExecuting && this->TimeoutReason_ == TimeoutReason::Normal) {
    cmCTestTestHandler::cmCTestTestProperties* p =
      this->Runner->GetTestProperties();
    if (p->TimeoutSignal) {
      this->TerminationStyle = Termination::Custom;
      uv_process_kill(this->Process, p->TimeoutSignal->Number);
      if (p->TimeoutGracePeriod) {
        this->Timeout = *p->TimeoutGracePeriod;
      } else {
        static const cmDuration defaultGracePeriod{ 1.0 };
        this->Timeout = defaultGracePeriod;
      }
      this->StartTimer();
      return;
    }
  }

  this->TerminationStyle = Termination::Forced;
  bool const was_still_reading = !this->ReadHandleClosed;
  if (!this->ReadHandleClosed) {
    this->ReadHandleClosed = true;
    this->PipeReader.reset();
  }
  if (!this->ProcessHandleClosed) {
    // Kill the child and let our on-exit handler finish the test.
    cmsysProcess_KillPID(static_cast<unsigned long>(this->Process->pid));
  } else if (was_still_reading) {
    // Our on-exit handler already ran but did not finish the test
    // because we were still reading output.  We've just dropped
    // our read handler, so we need to finish the test now.
    this->Finish();
  }
}